

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProString::operator<(ProString *this,ProString *other)

{
  char16_t *pcVar1;
  CutResult CVar2;
  byte extraout_var;
  char16_t *pcVar3;
  long lVar4;
  char16_t *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  long local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->m_string).d.ptr;
  local_38 = (long)this->m_offset;
  local_40 = (long)this->m_length;
  CVar2 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_38,&local_40);
  pcVar5 = (char16_t *)0x0;
  lVar6 = 0;
  if (CVar2 != Null) {
    pcVar5 = pcVar1 + local_38;
    lVar6 = local_40;
  }
  pcVar1 = (other->m_string).d.ptr;
  local_38 = (long)other->m_offset;
  local_40 = (long)other->m_length;
  CVar2 = QtPrivate::QContainerImplHelper::mid((other->m_string).d.size,&local_38,&local_40);
  pcVar3 = (char16_t *)0x0;
  lVar4 = 0;
  if (CVar2 != Null) {
    pcVar3 = pcVar1 + local_38;
    lVar4 = local_40;
  }
  QVar7.m_data = pcVar5;
  QVar7.m_size = lVar6;
  QVar8.m_data = pcVar3;
  QVar8.m_size = lVar4;
  QtPrivate::compareStrings(QVar7,QVar8,CaseSensitive);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(extraout_var >> 7);
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const ProString &other) const { return toQStringView() < other.toQStringView(); }